

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Xxx::doSomething(Xxx *this)

{
  long lVar1;
  ostream *poVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    memset(this->buffer,0x78,this->size);
    poVar2 = std::operator<<((ostream *)&std::cout,"doSomething buffer(");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::operator<<(poVar2,")\n");
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void doSomething(void)
    {
        if (0 < size)
        {
            memset(buffer, 'x', size);
            std::cout << "doSomething buffer(" << size << ")\n";
        }
    }